

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

void Dau_DsdToTruth_rec(char *pStr,char **p,int *pMatches,word **pTtElems,word *pRes,int nVars)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  int w;
  int nVars_00;
  char *pcVar4;
  int nWords;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  word *pwVar10;
  word pFunc [64];
  word pTtTemp [64];
  word local_1638 [64];
  word local_1438 [641];
  
  uVar6 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar6 = 1;
  }
  nWords = (int)uVar6;
  pcVar4 = *p;
  cVar2 = *pcVar4;
  cVar3 = cVar2;
  if (cVar2 == '!') {
    *p = pcVar4 + 1;
    pcVar9 = pcVar4 + 1;
    pcVar4 = pcVar4 + 1;
    cVar3 = *pcVar9;
  }
  bVar1 = cVar3 + 0x9f;
  if (bVar1 < 0x1a) {
    if (nVars <= (int)(uint)bVar1) {
      __assert_fail("**p - \'a\' >= 0 && **p - \'a\' < nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x21f,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    Abc_TtCopy(pRes,pTtElems[bVar1],nWords,(uint)(cVar2 == '!'));
    return;
  }
  if (cVar3 == '[') {
    iVar5 = pMatches[(long)pcVar4 - (long)pStr];
    if (pStr[iVar5] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x236,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    Abc_TtConst0(pRes,nWords);
    uVar7 = 0;
    if (0 < nWords) {
      uVar7 = uVar6;
    }
    while( true ) {
      pcVar4 = *p + 1;
      *p = pcVar4;
      if (pStr + iVar5 <= pcVar4) break;
      Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,pTtTemp,nVars);
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        pRes[uVar6] = pRes[uVar6] ^ pTtTemp[uVar6];
      }
    }
    if (pcVar4 != pStr + iVar5) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x23d,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
  }
  else if (cVar3 == '<') {
    iVar5 = pMatches[(long)pcVar4 - (long)pStr];
    if (pStr[iVar5] != '>') {
      __assert_fail("**p == \'<\' && *q == \'>\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x246,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    pcVar4 = pcVar4 + 1;
    *p = pcVar4;
    lVar8 = 3;
    pwVar10 = pTtTemp;
    while (pcVar4 < pStr + iVar5) {
      Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,pwVar10,nVars);
      pcVar4 = *p + 1;
      *p = pcVar4;
      lVar8 = lVar8 + -1;
      pwVar10 = pwVar10 + 0x40;
    }
    if (lVar8 != 0) {
      __assert_fail("i == 3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x249,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    Abc_TtMux(pRes,pTtTemp,local_1638,local_1438,nWords);
    if (*p != pStr + iVar5) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x24b,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
  }
  else if (cVar3 == '(') {
    iVar5 = pMatches[(long)pcVar4 - (long)pStr];
    if (pStr[iVar5] != ')') {
      __assert_fail("**p == \'(\' && *q == \')\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x227,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    Abc_TtConst1(pRes,nWords);
    uVar7 = 0;
    if (0 < nWords) {
      uVar7 = uVar6;
    }
    while( true ) {
      pcVar4 = *p + 1;
      *p = pcVar4;
      if (pStr + iVar5 <= pcVar4) break;
      Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,pTtTemp,nVars);
      for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
        pRes[uVar6] = pRes[uVar6] & pTtTemp[uVar6];
      }
    }
    if (pcVar4 != pStr + iVar5) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x22e,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
  }
  else {
    if (5 < (byte)(cVar3 + 0xbfU) && 9 < (byte)(cVar3 - 0x30U)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x25f,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    nVars_00 = Abc_TtReadHex(pFunc,pcVar4);
    iVar5 = 1 << ((char)nVars_00 - 2U & 0x1f);
    if (nVars_00 < 3) {
      iVar5 = 1;
    }
    pcVar9 = *p;
    pcVar4 = pcVar9 + iVar5;
    *p = pcVar4;
    if ((pcVar9[iVar5] != '{') ||
       (pcVar9 = pStr + pMatches[(long)pcVar4 - (long)pStr], *pcVar9 != '}')) {
      __assert_fail("**p == \'{\' && *q == \'}\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x256,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    pcVar4 = pcVar4 + 1;
    *p = pcVar4;
    pwVar10 = pTtTemp;
    iVar5 = nVars_00;
    while (pcVar4 < pcVar9) {
      Dau_DsdToTruth_rec(pStr,p,pMatches,pTtElems,pwVar10,nVars);
      pcVar4 = *p + 1;
      *p = pcVar4;
      iVar5 = iVar5 + -1;
      pwVar10 = pwVar10 + 0x40;
    }
    if (iVar5 != 0) {
      __assert_fail("i == nVarsF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x259,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    if (pcVar4 != pcVar9) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/dau/dauDsd.c"
                    ,0x25a,"void Dau_DsdToTruth_rec(char *, char **, int *, word **, word *, int)");
    }
    Dau_DsdTruthCompose_rec(pFunc,&pTtTemp,pRes,nVars_00,nWords);
  }
  if (cVar2 == '!') {
    Abc_TtNot(pRes,nWords);
  }
  return;
}

Assistant:

void Dau_DsdToTruth_rec( char * pStr, char ** p, int * pMatches, word ** pTtElems, word * pRes, int nVars )
{
    int nWords = Abc_TtWordNum( nVars );
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        assert( **p - 'a' >= 0 && **p - 'a' < nVars );
        Abc_TtCopy( pRes, pTtElems[**p - 'a'], nWords, fCompl );
        return;
    }
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[DAU_MAX_WORD];
        assert( **p == '(' && *q == ')' );
        Abc_TtConst1( pRes, nWords );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp, nVars );
            Abc_TtAnd( pRes, pRes, pTtTemp, nWords, 0 );
        }
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[DAU_MAX_WORD];
        assert( **p == '[' && *q == ']' );
        Abc_TtConst0( pRes, nWords );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp, nVars );
            Abc_TtXor( pRes, pRes, pTtTemp, nWords, 0 );
        }
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( **p == '<' ) // mux
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word pTtTemp[3][DAU_MAX_WORD];
        int i;
        assert( **p == '<' && *q == '>' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pTtTemp[i], nVars );
        assert( i == 3 );
        Abc_TtMux( pRes, pTtTemp[0], pTtTemp[1], pTtTemp[2], nWords );
        assert( *p == q );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word pFanins[DAU_MAX_VAR][DAU_MAX_WORD], pFunc[DAU_MAX_WORD];
        char * q;
        int i, nVarsF = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVarsF );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Dau_DsdToTruth_rec( pStr, p, pMatches, pTtElems, pFanins[i], nVars );
        assert( i == nVarsF );
        assert( *p == q );
        Dau_DsdTruthCompose_rec( pFunc, pFanins, pRes, nVarsF, nWords );
        if ( fCompl ) Abc_TtNot( pRes, nWords );
        return;
    }
    assert( 0 );
}